

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O1

size_t __thiscall
google::protobuf::SourceCodeInfo_Location::ByteSizeLong(SourceCodeInfo_Location *this)

{
  long lVar1;
  int iVar2;
  anon_union_96_1_493b367e_for_SourceCodeInfo_Location_3 aVar3;
  uint uVar4;
  size_t sVar5;
  size_t sVar6;
  Value<google::protobuf::internal::GenericTypeHandler<std::string>_> *pVVar7;
  uint uVar8;
  uint index;
  int n;
  
  sVar5 = protobuf::internal::WireFormatLite::Int32SizeWithPackedTagSize
                    (&(this->field_0)._impl_.path_,1,&(this->field_0)._impl_._path_cached_byte_size_
                    );
  sVar6 = protobuf::internal::WireFormatLite::Int32SizeWithPackedTagSize
                    (&(this->field_0)._impl_.span_,1,&(this->field_0)._impl_._span_cached_byte_size_
                    );
  uVar8 = *(uint *)((long)&this->field_0 + 0x40);
  sVar5 = sVar6 + sVar5 + (ulong)uVar8;
  if (0 < (int)uVar8) {
    index = 0;
    do {
      pVVar7 = protobuf::internal::RepeatedPtrFieldBase::
               Get<google::protobuf::internal::GenericTypeHandler<std::__cxx11::string>>
                         (&(this->field_0)._impl_.leading_detached_comments_.
                           super_RepeatedPtrFieldBase,index);
      uVar4 = (uint)pVVar7->_M_string_length | 1;
      iVar2 = 0x1f;
      if (uVar4 != 0) {
        for (; uVar4 >> iVar2 == 0; iVar2 = iVar2 + -1) {
        }
      }
      sVar5 = sVar5 + pVVar7->_M_string_length + (ulong)(iVar2 * 9 + 0x49U >> 6);
      index = index + 1;
    } while (uVar8 != index);
  }
  aVar3 = this->field_0;
  if (((undefined1  [96])aVar3 & (undefined1  [96])0x3) != (undefined1  [96])0x0) {
    if (((undefined1  [96])aVar3 & (undefined1  [96])0x1) != (undefined1  [96])0x0) {
      lVar1 = *(long *)(((ulong)(this->field_0)._impl_.leading_comments_.tagged_ptr_.ptr_ &
                        0xfffffffffffffffc) + 8);
      uVar8 = (uint)lVar1 | 1;
      iVar2 = 0x1f;
      if (uVar8 != 0) {
        for (; uVar8 >> iVar2 == 0; iVar2 = iVar2 + -1) {
        }
      }
      sVar5 = sVar5 + lVar1 + (ulong)(iVar2 * 9 + 0x49U >> 6) + 1;
    }
    if (((undefined1  [96])aVar3 & (undefined1  [96])0x2) != (undefined1  [96])0x0) {
      lVar1 = *(long *)(((ulong)(this->field_0)._impl_.trailing_comments_.tagged_ptr_.ptr_ &
                        0xfffffffffffffffc) + 8);
      uVar8 = (uint)lVar1 | 1;
      iVar2 = 0x1f;
      if (uVar8 != 0) {
        for (; uVar8 >> iVar2 == 0; iVar2 = iVar2 + -1) {
        }
      }
      sVar5 = sVar5 + lVar1 + (ulong)(iVar2 * 9 + 0x49U >> 6) + 1;
    }
  }
  sVar5 = Message::MaybeComputeUnknownFieldsSize
                    (&this->super_Message,sVar5,&(this->field_0)._impl_._cached_size_);
  return sVar5;
}

Assistant:

::size_t SourceCodeInfo_Location::ByteSizeLong() const {
  const SourceCodeInfo_Location& this_ = *this;
#endif  // PROTOBUF_CUSTOM_VTABLE
  // @@protoc_insertion_point(message_byte_size_start:google.protobuf.SourceCodeInfo.Location)
  ::size_t total_size = 0;

  ::uint32_t cached_has_bits = 0;
  // Prevent compiler warnings about cached_has_bits being unused
  (void)cached_has_bits;

  ::_pbi::Prefetch5LinesFrom7Lines(&this_);
   {
    // repeated int32 path = 1 [packed = true];
    {
      total_size +=
          ::_pbi::WireFormatLite::Int32SizeWithPackedTagSize(
              this_._internal_path(), 1,
              this_._impl_._path_cached_byte_size_);
    }
    // repeated int32 span = 2 [packed = true];
    {
      total_size +=
          ::_pbi::WireFormatLite::Int32SizeWithPackedTagSize(
              this_._internal_span(), 1,
              this_._impl_._span_cached_byte_size_);
    }
    // repeated string leading_detached_comments = 6;
    {
      total_size +=
          1 * ::google::protobuf::internal::FromIntSize(this_._internal_leading_detached_comments().size());
      for (int i = 0, n = this_._internal_leading_detached_comments().size(); i < n; ++i) {
        total_size += ::google::protobuf::internal::WireFormatLite::StringSize(
            this_._internal_leading_detached_comments().Get(i));
      }
    }
  }
  cached_has_bits = this_._impl_._has_bits_[0];
  if ((cached_has_bits & 0x00000003u) != 0) {
    // optional string leading_comments = 3;
    if ((cached_has_bits & 0x00000001u) != 0) {
      total_size += 1 + ::google::protobuf::internal::WireFormatLite::StringSize(
                                      this_._internal_leading_comments());
    }
    // optional string trailing_comments = 4;
    if ((cached_has_bits & 0x00000002u) != 0) {
      total_size += 1 + ::google::protobuf::internal::WireFormatLite::StringSize(
                                      this_._internal_trailing_comments());
    }
  }
  return this_.MaybeComputeUnknownFieldsSize(total_size,
                                             &this_._impl_._cached_size_);
}